

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

slice_instructions * llava_uhd::get_slice_instructions(clip_ctx *ctx,clip_image_size *original_size)

{
  int iVar1;
  bool bVar2;
  int __y;
  int iVar3;
  clip_image_size cVar4;
  int *piVar5;
  clip_image_size cVar6;
  clip_image_size __x;
  int *in_RDX;
  clip_ctx *in_RSI;
  slice_instructions *in_RDI;
  undefined4 uVar7;
  float __x_00;
  undefined4 extraout_XMM0_Db;
  double dVar8;
  clip_image_size *original_size_00;
  slice_coordinates slice_1;
  int jc;
  int patches_x;
  int ic;
  int patches_y;
  int grid_y;
  int grid_x;
  int height;
  int width;
  clip_image_size refine_size_1;
  clip_image_size best_grid;
  clip_image_size best_size;
  slice_coordinates slice;
  int x;
  int y;
  clip_image_size refine_size;
  bool has_pinpoints;
  bool has_slices;
  int multiple;
  float ratio;
  float log_ratio;
  int original_height;
  int original_width;
  int max_slice_nums;
  int slice_size;
  int patch_size;
  slice_instructions *res;
  clip_ctx *in_stack_fffffffffffffeb8;
  undefined6 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  value_type *in_stack_fffffffffffffec8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffed0;
  clip_image_size *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined1 allow_upscale;
  undefined8 in_stack_fffffffffffffee8;
  clip_image_size *in_stack_fffffffffffffef0;
  slice_instructions *pinpoints;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  undefined4 local_64;
  undefined4 uStack_60;
  float in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int iStack_50;
  int32_t local_24;
  int32_t local_20;
  undefined1 local_19;
  int *local_18;
  clip_ctx *local_10;
  
  allow_upscale = (undefined1)((ulong)in_stack_fffffffffffffee0 >> 0x38);
  local_19 = 0;
  pinpoints = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  slice_instructions::slice_instructions
            ((slice_instructions *)
             CONCAT17(in_stack_fffffffffffffec7,
                      CONCAT16(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0)));
  local_20 = clip_get_patch_size(local_10);
  local_24 = clip_get_image_size(local_10);
  __y = get_max_slices(in_stack_fffffffffffffeb8);
  iVar3 = *local_18;
  iVar1 = local_18[1];
  dVar8 = std::log((double)CONCAT44(extraout_XMM0_Db,(float)iVar3 / (float)iVar1));
  uVar7 = SUB84(dVar8,0);
  dVar8 = std::ceil((double)(ulong)(uint)(((float)iVar3 * (float)iVar1) /
                                         (float)(local_24 * local_24)));
  __x_00 = SUB84(dVar8,0);
  original_size_00 = (clip_image_size *)std::fmin<float,int>(__x_00,__y);
  iVar3 = (int)(double)original_size_00;
  bVar2 = std::vector<int,_std::allocator<int>_>::empty(in_stack_fffffffffffffed0);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    cVar6 = get_best_resize(in_stack_fffffffffffffed8,
                            (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                            (int)in_stack_fffffffffffffed0,
                            SUB81((ulong)in_stack_fffffffffffffec8 >> 0x38,0));
    pinpoints->overview_size = cVar6;
    if (iVar3 < 2) {
      (pinpoints->refined_size).width = 0;
      (pinpoints->refined_size).height = 0;
      (pinpoints->grid_size).width = 0;
      (pinpoints->grid_size).height = 0;
    }
    else {
      cVar4 = get_best_grid(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                            in_stack_ffffffffffffffa4);
      cVar6 = cVar4;
      __x = get_refine_size(original_size_00,in_stack_fffffffffffffef0,
                            (int)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                            (int)in_stack_fffffffffffffee8,(bool)allow_upscale);
      pinpoints->grid_size = cVar4;
      pinpoints->refined_size = __x;
      local_b0 = __x.width;
      iStack_ac = __x.height;
      local_a8 = cVar4.width;
      iStack_a4 = cVar4.height;
      local_c8 = 0;
      for (local_c4 = 0; local_c4 < iStack_ac && local_c8 < iStack_a4;
          local_c4 = iStack_ac / iStack_a4 + local_c4) {
        local_d0 = 0;
        for (local_cc = 0; local_cc < local_b0 && local_d0 < local_a8;
            local_cc = local_b0 / local_a8 + local_cc) {
          std::vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>::
          push_back((vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                     *)cVar6,(value_type *)__x);
          local_d0 = local_d0 + 1;
        }
        local_c8 = local_c8 + 1;
      }
    }
  }
  else {
    cVar4 = select_best_resolution
                      ((vector<int,_std::allocator<int>_> *)pinpoints,
                       (clip_image_size *)CONCAT44(uVar7,__x_00));
    cVar6.height = local_24;
    cVar6.width = local_24;
    pinpoints->overview_size = cVar6;
    pinpoints->refined_size = cVar4;
    local_64 = 0;
    uStack_60 = 0;
    (pinpoints->grid_size).width = 0;
    (pinpoints->grid_size).height = 0;
    pinpoints->padding_refined = true;
    for (local_68 = 0; iStack_50 = cVar4.height, local_68 < iStack_50;
        local_68 = local_24 + local_68) {
      for (local_6c = 0; local_6c < cVar4.width; local_6c = local_24 + local_6c) {
        local_7c = local_6c;
        local_78 = local_68;
        local_80 = cVar4.width - local_6c;
        piVar5 = std::min<int>(&local_24,&local_80);
        local_74 = *piVar5;
        local_84 = iStack_50 - local_68;
        piVar5 = std::min<int>(&local_24,&local_84);
        local_70 = *piVar5;
        std::vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>::
        push_back((vector<llava_uhd::slice_coordinates,_std::allocator<llava_uhd::slice_coordinates>_>
                   *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        if (local_6c == 0) {
          (pinpoints->grid_size).width = (pinpoints->grid_size).width + 1;
        }
      }
      (pinpoints->grid_size).height = (pinpoints->grid_size).height + 1;
    }
  }
  return in_RDI;
}

Assistant:

static slice_instructions get_slice_instructions(struct clip_ctx * ctx, const clip_image_size & original_size) {
        slice_instructions res;
        const int patch_size      = clip_get_patch_size(ctx);
        const int slice_size      = clip_get_image_size(ctx);
        const int max_slice_nums  = get_max_slices(ctx);
        const int original_width  = original_size.width;
        const int original_height = original_size.height;
        const float log_ratio = log((float)original_width / original_height);
        const float ratio = (float)original_width * original_height / (slice_size * slice_size);
        const int multiple = fmin(ceil(ratio), max_slice_nums);
        const bool has_slices = (multiple > 1);
        const bool has_pinpoints = !ctx->vision_model.hparams.image_grid_pinpoints.empty();

        if (has_pinpoints) {
            // has pinpoints, use them to calculate the grid size (e.g. llava-1.6)
            auto refine_size = llava_uhd::select_best_resolution(
                ctx->vision_model.hparams.image_grid_pinpoints,
                original_size);
            res.overview_size   = clip_image_size{slice_size, slice_size};
            res.refined_size    = refine_size;
            res.grid_size       = clip_image_size{0, 0};
            res.padding_refined = true;

            for (int y = 0; y < refine_size.height; y += slice_size) {
                for (int x = 0; x < refine_size.width; x += slice_size) {
                    slice_coordinates slice;
                    slice.x = x;
                    slice.y = y;
                    slice.size.width  = std::min(slice_size, refine_size.width  - x);
                    slice.size.height = std::min(slice_size, refine_size.height - y);
                    res.slices.push_back(slice);
                    if (x == 0) {
                        res.grid_size.width++;
                    }
                }
                res.grid_size.height++;
            }

            return res;
        }

        // no pinpoints, dynamically calculate the grid size (e.g. minicpmv)

        auto best_size    = get_best_resize(original_size, slice_size, patch_size, has_slices);
        res.overview_size = best_size;

        if (!has_slices) {
            // skip slicing logic
            res.refined_size = clip_image_size{0, 0};
            res.grid_size    = clip_image_size{0, 0};

        } else {
            auto best_grid   = get_best_grid(max_slice_nums, multiple, log_ratio);
            auto refine_size = get_refine_size(original_size, best_grid, slice_size, patch_size, true);
            res.grid_size    = best_grid;
            res.refined_size = refine_size;

            int width  = refine_size.width;
            int height = refine_size.height;
            int grid_x = int(width  / best_grid.width);
            int grid_y = int(height / best_grid.height);
            for (int patches_y = 0,                    ic = 0;
                    patches_y < refine_size.height && ic < best_grid.height;
                    patches_y += grid_y,              ic += 1) {
                for (int patches_x = 0,                   jc = 0;
                        patches_x < refine_size.width && jc < best_grid.width;
                        patches_x += grid_x,             jc += 1) {
                    slice_coordinates slice;
                    slice.x = patches_x;
                    slice.y = patches_y;
                    slice.size.width  = grid_x;
                    slice.size.height = grid_y;
                    res.slices.push_back(slice);
                    // LOG_INF("slice %d: %d %d %d %d\n", ic, patches_i, patches_j, grid_x, grid_y);
                }
            }
        }

        return res;
    }